

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

void duckdb_yyjson::dyn_free(void *ctx_ptr,void *ptr)

{
  ulong *puVar1;
  ulong *puVar2;
  dyn_ctx *ctx;
  ulong *puVar3;
  
  puVar1 = (ulong *)((long)ptr - 0x10);
  puVar3 = (ulong *)((long)ctx_ptr + 0x10);
  do {
    puVar2 = puVar3;
    puVar3 = (ulong *)puVar2[1];
    if (puVar3 == (ulong *)0x0) goto LAB_00f0da99;
  } while (puVar3 != puVar1);
  puVar2[1] = puVar3[1];
  puVar3[1] = 0;
LAB_00f0da99:
  do {
    puVar3 = (ulong *)ctx_ptr;
    if (puVar3 == (ulong *)0x0) {
      return;
    }
    ctx_ptr = (void *)puVar3[1];
  } while (((ulong *)ctx_ptr != (ulong *)0x0) && (*ctx_ptr < *puVar1));
  *(void **)((long)ptr + -8) = ctx_ptr;
  puVar3[1] = (ulong)puVar1;
  return;
}

Assistant:

static void dyn_free(void *ctx_ptr, void *ptr) {
    /* assert(ptr != NULL) */
    dyn_ctx *ctx = (dyn_ctx *)ctx_ptr;
    dyn_chunk *chunk = (dyn_chunk *)ptr - 1, *prev;

    dyn_chunk_list_remove(&ctx->used_list, chunk);
    for (prev = &ctx->free_list; prev; prev = prev->next) {
        if (!prev->next || prev->next->size >= chunk->size) {
            chunk->next = prev->next;
            prev->next = chunk;
            break;
        }
    }
}